

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSizeTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::TextureSizeTests::init(TextureSizeTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  TestContext *pTVar4;
  RenderContext *pRVar5;
  TestNode *pTVar6;
  ostream *poVar7;
  size_t sVar8;
  Texture2DSizeCase *this_00;
  long lVar9;
  long lVar10;
  TextureCubeSizeCase *this_01;
  long lVar11;
  char *pcVar12;
  TestNode *pTVar13;
  int iVar14;
  int local_1fc;
  long *local_1d0;
  long local_1c0 [2];
  TestNode *local_1b0;
  ostringstream name;
  ios_base local_138 [264];
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Size Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  lVar10 = 0;
  local_1b0 = (TestNode *)this;
  do {
    uVar1 = (&DAT_0063f5d0)[lVar10 * 2];
    uVar2 = (&DAT_0063f5d4)[lVar10 * 2];
    local_1fc = 1;
    if ((uVar1 & uVar1 - 1) == 0) {
      local_1fc = ((uVar2 - 1 & uVar2) == 0) + 1;
    }
    lVar9 = 0;
    do {
      iVar14 = 0;
      do {
        pTVar13 = local_1b0;
        pcVar12 = "";
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        poVar7 = (ostream *)std::ostream::operator<<((ostringstream *)&name,uVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
        pcVar3 = (char *)(&DAT_00775380)[lVar9 * 2];
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar3,sVar8);
        }
        if (iVar14 != 0) {
          pcVar12 = "_mipmap";
        }
        lVar11 = 0;
        if (iVar14 != 0) {
          lVar11 = 7;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar12,lVar11);
        this_00 = (Texture2DSizeCase *)operator_new(0xf0);
        pTVar4 = pTVar13->m_testCtx;
        pRVar5 = ((Context *)pTVar13[1]._vptr_TestNode)->m_renderCtx;
        std::__cxx11::stringbuf::str();
        Texture2DSizeCase::Texture2DSizeCase
                  (this_00,pTVar4,pRVar5,(char *)local_1d0,"",(&DAT_00775388)[lVar9 * 4],
                   (&DAT_0077538c)[lVar9 * 4],uVar1,uVar2,iVar14 != 0);
        tcu::TestNode::addChild(pTVar6,(TestNode *)this_00);
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0,local_1c0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        std::ios_base::~ios_base(local_138);
        pTVar13 = local_1b0;
        iVar14 = iVar14 + 1;
      } while (local_1fc != iVar14);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 5);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar13->m_testCtx,"cube","Cubemap Texture Size Tests");
  tcu::TestNode::addChild(pTVar13,pTVar6);
  lVar10 = 0;
  do {
    uVar1 = (&DAT_0063f600)[lVar10 * 2];
    uVar2 = (&DAT_0063f604)[lVar10 * 2];
    local_1fc = 1;
    if ((uVar1 & uVar1 - 1) == 0) {
      local_1fc = ((uVar2 - 1 & uVar2) == 0) + 1;
    }
    lVar9 = 0;
    do {
      iVar14 = 0;
      do {
        pcVar12 = "";
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        poVar7 = (ostream *)std::ostream::operator<<((ostringstream *)&name,uVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x",1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
        pcVar3 = (char *)(&DAT_00775380)[lVar9 * 2];
        if (pcVar3 == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar3,sVar8);
        }
        if (iVar14 != 0) {
          pcVar12 = "_mipmap";
        }
        lVar11 = 0;
        if (iVar14 != 0) {
          lVar11 = 7;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar12,lVar11);
        this_01 = (TextureCubeSizeCase *)operator_new(0xf8);
        pTVar4 = pTVar13->m_testCtx;
        pRVar5 = (RenderContext *)pTVar13[1]._vptr_TestNode[1];
        std::__cxx11::stringbuf::str();
        TextureCubeSizeCase::TextureCubeSizeCase
                  (this_01,pTVar4,pRVar5,(char *)local_1d0,"",(&DAT_00775388)[lVar9 * 4],
                   (&DAT_0077538c)[lVar9 * 4],uVar1,uVar2,iVar14 != 0);
        tcu::TestNode::addChild(pTVar6,(TestNode *)this_01);
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0,local_1c0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        std::ios_base::~ios_base(local_138);
        iVar14 = iVar14 + 1;
        pTVar13 = local_1b0;
      } while (local_1fc != iVar14);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  return 6;
}

Assistant:

void TextureSizeTests::init (void)
{
	struct
	{
		int	width;
		int	height;
	} sizes2D[] =
	{
		{   64,   64 }, // Spec-mandated minimum.
		{   65,   63 },
		{  512,  512 },
		{ 1024, 1024 },
		{ 2048, 2048 }
	};

	struct
	{
		int	width;
		int	height;
	} sizesCube[] =
	{
		{  15,  15 },
		{  16,  16 }, // Spec-mandated minimum
		{  64,  64 },
		{ 128, 128 },
		{ 256, 256 },
		{ 512, 512 }
	};

	struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} formats[] =
	{
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	// 2D cases.
	tcu::TestCaseGroup* group2D = new tcu::TestCaseGroup(m_testCtx, "2d", "2D Texture Size Tests");
	addChild(group2D);
	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes2D); sizeNdx++)
	{
		int		width	= sizes2D[sizeNdx].width;
		int		height	= sizes2D[sizeNdx].height;
		bool	isPOT	= deIsPowerOfTwo32(width) && deIsPowerOfTwo32(height);

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
		{
			for (int mipmap = 0; mipmap < (isPOT ? 2 : 1); mipmap++)
			{
				std::ostringstream name;
				name << width << "x" << height << "_" << formats[formatNdx].name << (mipmap ? "_mipmap" : "");

				group2D->addChild(new Texture2DSizeCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
														formats[formatNdx].format, formats[formatNdx].dataType,
														width, height, mipmap != 0));
			}
		}
	}

	// Cubemap cases.
	tcu::TestCaseGroup* groupCube = new tcu::TestCaseGroup(m_testCtx, "cube", "Cubemap Texture Size Tests");
	addChild(groupCube);
	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizesCube); sizeNdx++)
	{
		int		width	= sizesCube[sizeNdx].width;
		int		height	= sizesCube[sizeNdx].height;
		bool	isPOT	= deIsPowerOfTwo32(width) && deIsPowerOfTwo32(height);

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
		{
			for (int mipmap = 0; mipmap < (isPOT ? 2 : 1); mipmap++)
			{
				std::ostringstream name;
				name << width << "x" << height << "_" << formats[formatNdx].name << (mipmap ? "_mipmap" : "");

				groupCube->addChild(new TextureCubeSizeCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
															formats[formatNdx].format, formats[formatNdx].dataType,
															width, height, mipmap != 0));
			}
		}
	}
}